

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O0

bool pvmath::parallelLine<double>(void)

{
  uint uVar1;
  uint32_t uVar2;
  bool bVar3;
  LineBase2D<double> *this;
  double dVar4;
  double dVar5;
  LineBase2D<double> line2;
  bool inverse;
  PointBase2D<double> offset;
  LineBase2D<double> line1;
  PointBase2D<double> point2;
  PointBase2D<double> point1;
  uint32_t i;
  PointBase2D<double> *in_stack_ffffffffffffff28;
  PointBase2D<double> *in_stack_ffffffffffffff30;
  LineBase2D<double> *in_stack_ffffffffffffff38;
  PointBase2D<double> in_stack_ffffffffffffff60;
  LineBase2D<double> *this_00;
  PointBase2D<double> in_stack_ffffffffffffff70;
  PointBase2D<double> local_58 [3];
  undefined1 local_28 [32];
  uint local_8;
  
  local_8 = 0;
  while( true ) {
    uVar1 = local_8;
    this_00 = (LineBase2D<double> *)in_stack_ffffffffffffff70.x;
    uVar2 = Test_Helper::runCount();
    if (uVar2 <= uVar1) {
      return true;
    }
    this = (LineBase2D<double> *)
           Unit_Test::randomFloatValue<double>
                     ((double)in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30,
                      (double)in_stack_ffffffffffffff28);
    dVar4 = Unit_Test::randomFloatValue<double>
                      ((double)in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30,
                       (double)in_stack_ffffffffffffff28);
    PointBase2D<double>::PointBase2D((PointBase2D<double> *)(local_28 + 0x10),(double)this,dVar4);
    dVar4 = Unit_Test::randomFloatValue<double>
                      ((double)in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30,
                       (double)in_stack_ffffffffffffff28);
    dVar5 = Unit_Test::randomFloatValue<double>
                      ((double)in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30,
                       (double)in_stack_ffffffffffffff28);
    PointBase2D<double>::PointBase2D((PointBase2D<double> *)local_28,dVar4,dVar5);
    LineBase2D<double>::LineBase2D
              (this_00,(PointBase2D<double> *)in_stack_ffffffffffffff60.y,
               (PointBase2D<double> *)in_stack_ffffffffffffff60.x);
    dVar4 = Unit_Test::randomFloatValue<double>
                      ((double)in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30,
                       (double)in_stack_ffffffffffffff28);
    dVar5 = Unit_Test::randomFloatValue<double>
                      ((double)in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30,
                       (double)in_stack_ffffffffffffff28);
    PointBase2D<double>::PointBase2D(local_58,dVar4,dVar5);
    bVar3 = (local_8 & 1) != 0;
    if (bVar3) {
      in_stack_ffffffffffffff38 = (LineBase2D<double> *)local_28;
    }
    else {
      in_stack_ffffffffffffff38 = (LineBase2D<double> *)(local_28 + 0x10);
    }
    in_stack_ffffffffffffff70 =
         PointBase2D<double>::operator+(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (bVar3) {
      in_stack_ffffffffffffff30 = (PointBase2D<double> *)(local_28 + 0x10);
    }
    else {
      in_stack_ffffffffffffff30 = (PointBase2D<double> *)local_28;
    }
    in_stack_ffffffffffffff60 =
         PointBase2D<double>::operator+(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    LineBase2D<double>::LineBase2D
              ((LineBase2D<double> *)in_stack_ffffffffffffff70.x,
               (PointBase2D<double> *)in_stack_ffffffffffffff60.y,
               (PointBase2D<double> *)in_stack_ffffffffffffff60.x);
    bVar3 = LineBase2D<double>::isParallel(this,in_stack_ffffffffffffff38);
    if (!bVar3) break;
    local_8 = local_8 + 1;
  }
  return false;
}

Assistant:

bool parallelLine()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const PointBase2D<_Type> point1( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const PointBase2D<_Type> point2( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const LineBase2D<_Type> line1( point1, point2 );

            const PointBase2D<_Type> offset( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const bool inverse = ( (i % 2) == 0 );
            const LineBase2D<_Type> line2( (inverse ? point1 : point2) + offset, (inverse ? point2 : point1) + offset );
            if ( !line1.isParallel( line2 ) )
                return false;
        }
        return true;
    }